

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O1

void traverse_hplane_csc<PredictionData<float,unsigned_long>,unsigned_long>
               (WorkerForPredictCSC *workspace,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,ExtIsoForest *model_outputs,
               PredictionData<float,_unsigned_long> *prediction_data,unsigned_long *tree_num,
               double *per_tree_depths,size_t curr_tree,bool has_range_penalty)

{
  CategSplit cat_split_type;
  pointer pdVar1;
  pointer pIVar2;
  ulong uVar3;
  unsigned_long uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  pointer pIVar8;
  pointer puVar9;
  double *pdVar10;
  ulong uVar11;
  int chosen_cat;
  int iVar12;
  pointer puVar13;
  double dVar14;
  double unused;
  long local_80;
  double *local_68;
  long local_58;
  double local_38;
  
  pIVar8 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar8[curr_tree].hplane_left == 0) {
    uVar6 = workspace->st;
    uVar3 = workspace->end;
    if (uVar6 <= uVar3) {
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = uVar6;
      do {
        uVar4 = puVar9[uVar11];
        pdVar1[uVar4] = pIVar8[curr_tree].score + pdVar1[uVar4];
        uVar11 = uVar11 + 1;
      } while (uVar11 <= uVar3);
    }
    if ((tree_num != (unsigned_long *)0x0) && (uVar6 <= uVar3)) {
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar6;
      do {
        tree_num[puVar9[uVar11]] = curr_tree;
        uVar11 = uVar11 + 1;
      } while (uVar11 <= uVar3);
    }
    if ((per_tree_depths != (double *)0x0) && (uVar6 <= uVar3)) {
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        per_tree_depths[puVar9[uVar6]] = pIVar8[curr_tree].score;
        uVar6 = uVar6 + 1;
      } while (uVar6 <= uVar3);
    }
  }
  else {
    puVar13 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar9 = puVar13 + workspace->st;
    puVar13 = puVar13 + workspace->end + 1;
    if (puVar9 != puVar13) {
      uVar6 = (long)puVar13 - (long)puVar9 >> 3;
      lVar7 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar9,puVar13,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar9);
    }
    pdVar1 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = workspace->end - workspace->st;
    if (pdVar1 != pdVar1 + lVar7 + 1) {
      memset(pdVar1,0,lVar7 * 8 + 8);
    }
    pIVar2 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pIVar8 = pIVar2 + curr_tree;
    puVar9 = *(pointer *)
              &pIVar2[curr_tree].col_num.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    puVar13 = *(pointer *)
               ((long)&pIVar2[curr_tree].col_num.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               );
    if (prediction_data->categ_data == (int *)0x0) {
      if (puVar13 != puVar9) {
        uVar6 = 0;
        do {
          pdVar10 = &local_38;
          if (model_outputs->missing_action != Fail) {
            pdVar10 = (double *)
                      (*(long *)&(pIVar8->fill_val).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + uVar6 * 8);
          }
          add_linear_comb<float,unsigned_long>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,puVar9[uVar6],
                     (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,prediction_data->Xc,
                     prediction_data->Xc_ind,prediction_data->Xc_indptr,
                     (double *)
                     (uVar6 * 8 +
                     *(long *)&(pIVar8->coef).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data),0.0,
                     *(double *)
                      (*(long *)&(pIVar8->mean).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + uVar6 * 8),pdVar10,
                     model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
          uVar6 = uVar6 + 1;
          pIVar2 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pIVar8 = pIVar2 + curr_tree;
          puVar9 = *(pointer *)
                    &pIVar2[curr_tree].col_num.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
        } while (uVar6 < (ulong)((long)*(pointer *)
                                        ((long)&pIVar2[curr_tree].col_num.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl + 8) - (long)puVar9 >> 3));
      }
    }
    else if (puVar13 != puVar9) {
      lVar7 = 0;
      uVar6 = 0;
      local_80 = 0;
      local_58 = 0;
      do {
        iVar12 = *(int *)(*(long *)&(pIVar8->col_type).
                                    super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
                                    super__Vector_impl_data + uVar6 * 4);
        if (iVar12 == 0x20) {
          cat_split_type = model_outputs->cat_split_type;
          iVar12 = 0;
          if (cat_split_type == SubSet) {
            lVar5 = *(long *)&(pIVar8->cat_coef).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            iVar12 = (int)((ulong)(*(long *)(lVar5 + 8 + local_80 * 0x18) -
                                  *(long *)(lVar5 + local_80 * 0x18)) >> 3);
            local_68 = *(double **)
                        (*(long *)&(pIVar8->cat_coef).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data + local_80 * 0x18);
          }
          else {
            local_68 = (double *)0x0;
          }
          dVar14 = 0.0;
          if (cat_split_type == SingleCateg) {
            dVar14 = *(double *)
                      (*(long *)&(pIVar8->fill_new).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + local_80 * 8);
          }
          chosen_cat = 0;
          if (cat_split_type == SingleCateg) {
            chosen_cat = *(int *)(*(long *)&(pIVar8->chosen_cat).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + local_80 * 4);
          }
          add_linear_comb<double>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,
                     (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     prediction_data->categ_data + prediction_data->nrows * puVar9[uVar6],iVar12,
                     local_68,dVar14,chosen_cat,
                     (double *)
                     (*(long *)&(pIVar8->fill_val).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + lVar7),
                     (double *)
                     (local_80 * 8 +
                     *(long *)&(pIVar8->fill_new).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data),(size_t *)0x0,(size_t *)0x0,
                     model_outputs->new_cat_action,model_outputs->missing_action,cat_split_type,
                     false);
          local_80 = local_80 + 1;
        }
        else if (iVar12 == 0x1f) {
          pdVar10 = &local_38;
          if (model_outputs->missing_action != Fail) {
            pdVar10 = (double *)
                      (*(long *)&(pIVar8->fill_val).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar7);
          }
          add_linear_comb<float,unsigned_long>
                    ((workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,workspace->st,workspace->end,puVar9[uVar6],
                     (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start,prediction_data->Xc,
                     prediction_data->Xc_ind,prediction_data->Xc_indptr,
                     (double *)
                     (local_58 * 8 +
                     *(long *)&(pIVar8->coef).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data),0.0,
                     *(double *)
                      (*(long *)&(pIVar8->mean).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + local_58 * 8),pdVar10,
                     model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
          local_58 = local_58 + 1;
        }
        uVar6 = uVar6 + 1;
        pIVar2 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pIVar8 = pIVar2 + curr_tree;
        puVar9 = *(pointer *)
                  &pIVar2[curr_tree].col_num.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
        lVar7 = lVar7 + 8;
      } while (uVar6 < (ulong)((long)*(pointer *)
                                      ((long)&pIVar2[curr_tree].col_num.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl + 8) - (long)puVar9 >> 3));
    }
    if (has_range_penalty) {
      uVar6 = workspace->st;
      uVar3 = workspace->end;
      if (uVar6 <= uVar3) {
        puVar9 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar10 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar8 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1 = (workspace->depths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          dVar14 = 1.0;
          if (pIVar8[curr_tree].range_low <= *pdVar10) {
            dVar14 = (double)(-(ulong)(pIVar8[curr_tree].range_high < *pdVar10) & 0x3ff0000000000000
                             );
          }
          uVar4 = puVar9[uVar6];
          pdVar1[uVar4] = pdVar1[uVar4] - dVar14;
          uVar6 = uVar6 + 1;
          pdVar10 = pdVar10 + 1;
        } while (uVar6 <= uVar3);
      }
    }
    uVar6 = workspace->st;
    uVar3 = workspace->end;
    pIVar8 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = uVar6;
    if (uVar6 <= uVar3) {
      puVar9 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar10 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar14 = pIVar8[curr_tree].split_point;
      do {
        if (*pdVar10 <= dVar14) {
          uVar4 = puVar9[uVar11];
          puVar9[uVar11] = puVar9[uVar6];
          puVar9[uVar6] = uVar4;
          uVar11 = uVar11 + 1;
        }
        uVar6 = uVar6 + 1;
        pdVar10 = pdVar10 + 1;
      } while (uVar6 <= uVar3);
    }
    uVar6 = workspace->end;
    if (workspace->st < uVar11) {
      workspace->end = uVar11 - 1;
      traverse_hplane_csc<PredictionData<float,unsigned_long>,unsigned_long>
                (workspace,hplanes,model_outputs,prediction_data,tree_num,per_tree_depths,
                 pIVar8[curr_tree].hplane_left,has_range_penalty);
    }
    if (uVar11 <= uVar6) {
      workspace->st = uVar11;
      workspace->end = uVar6;
      traverse_hplane_csc<PredictionData<float,unsigned_long>,unsigned_long>
                (workspace,hplanes,model_outputs,prediction_data,tree_num,per_tree_depths,
                 (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].hplane_right,has_range_penalty);
    }
  }
  return;
}

Assistant:

void traverse_hplane_csc(WorkerForPredictCSC      &workspace,
                         std::vector<IsoHPlane>   &hplanes,
                         ExtIsoForest             &model_outputs,
                         PredictionData           &prediction_data,
                         sparse_ix *restrict      tree_num,
                         double *restrict         per_tree_depths,
                         size_t                   curr_tree,
                         bool                     has_range_penalty)
{
    // if (hplanes[curr_tree].score >= 0)
    if (unlikely(hplanes[curr_tree].hplane_left == 0))
    {
        for (size_t row = workspace.st; row <= workspace.end; row++)
            workspace.depths[workspace.ix_arr[row]] += hplanes[curr_tree].score;
        if (unlikely(tree_num != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                tree_num[workspace.ix_arr[row]] = curr_tree;
        if (unlikely(per_tree_depths != NULL))
            for (size_t row = workspace.st; row <= workspace.end; row++)
                per_tree_depths[workspace.ix_arr[row]] = hplanes[curr_tree].score;
        return;
    }

    std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    std::fill(workspace.comb_val.begin(), workspace.comb_val.begin() + (workspace.end - workspace.st + 1), 0.);
    double unused;

    if (likely(prediction_data.categ_data == NULL))
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
            add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                            hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                            prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                            hplanes[curr_tree].coef[col], (double)0, hplanes[curr_tree].mean[col],
                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                            model_outputs.missing_action, NULL, NULL, false);
    }

    else
    {
        size_t ncols_numeric = 0;
        size_t ncols_categ = 0;
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
        {
            switch (hplanes[curr_tree].col_type[col])
            {
                case Numeric:
                {
                    add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                                    hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                    (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                    model_outputs.missing_action, NULL, NULL, false);
                    ncols_numeric++;
                    break;
                }

                case Categorical:
                {
                    add_linear_comb<double>(
                                    workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                    prediction_data.categ_data + hplanes[curr_tree].col_num[col] * prediction_data.nrows,
                                    (model_outputs.cat_split_type == SubSet)? (int)hplanes[curr_tree].cat_coef[ncols_categ].size() : 0,
                                    (model_outputs.cat_split_type == SubSet)? hplanes[curr_tree].cat_coef[ncols_categ].data() : NULL,
                                    (model_outputs.cat_split_type == SingleCateg)? hplanes[curr_tree].fill_new[ncols_categ] : 0.,
                                    (model_outputs.cat_split_type == SingleCateg)? hplanes[curr_tree].chosen_cat[ncols_categ] : 0,
                                    hplanes[curr_tree].fill_val[col], hplanes[curr_tree].fill_new[ncols_categ], NULL, NULL,
                                    model_outputs.new_cat_action, model_outputs.missing_action, model_outputs.cat_split_type, false);
                    ncols_categ++;
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }

    if (has_range_penalty)
    {
        for (size_t row = workspace.st; row <= workspace.end; row++)
            workspace.depths[workspace.ix_arr[row]]
                -=
            (workspace.comb_val[row - workspace.st] < hplanes[curr_tree].range_low) ||
            (workspace.comb_val[row - workspace.st] > hplanes[curr_tree].range_high);
    }

    /* divide data */
    size_t split_ix = divide_subset_split(workspace.ix_arr.data(), workspace.comb_val.data(),
                                          workspace.st, workspace.end, hplanes[curr_tree].split_point);

    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (split_ix > workspace.st)
    {
        workspace.end = split_ix - 1;
        traverse_hplane_csc(workspace,
                            hplanes,
                            model_outputs,
                            prediction_data,
                            tree_num,
                            per_tree_depths,
                            hplanes[curr_tree].hplane_left,
                            has_range_penalty);
    }

    if (split_ix <= orig_end)
    {
        workspace.st  = split_ix;
        workspace.end = orig_end;
        traverse_hplane_csc(workspace,
                            hplanes,
                            model_outputs,
                            prediction_data,
                            tree_num,
                            per_tree_depths,
                            hplanes[curr_tree].hplane_right,
                            has_range_penalty);
    }
}